

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O3

void jpgd::jpeg_decoder::decode_block_ac_first
               (jpeg_decoder *pD,int component_id,int block_x,int block_y)

{
  int iVar1;
  coeff_buf *pcVar2;
  uint8 *puVar3;
  huff_tables *phVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  
  iVar6 = pD->m_eob_run;
  if (iVar6 == 0) {
    pcVar2 = pD->m_ac_coeffs[component_id];
    iVar6 = pcVar2->block_num_x;
    if ((iVar6 <= block_x) || (pcVar2->block_num_y <= block_y)) {
LAB_00152dc9:
      stop_decoding(pD,JPGD_DECODE_ERROR);
    }
    iVar10 = pD->m_spectral_start;
    if (iVar10 <= pD->m_spectral_end) {
      iVar1 = pcVar2->block_size;
      puVar3 = pcVar2->pData;
      do {
        if ((7 < (ulong)(uint)pD->m_comp_ac_tab[component_id]) ||
           (phVar4 = pD->m_pHuff_tabs[(uint)pD->m_comp_ac_tab[component_id]],
           phVar4 == (huff_tables *)0x0)) goto LAB_00152dc9;
        uVar11 = (ulong)(int)phVar4->look_up[pD->m_bit_buf >> 0x18];
        if ((long)uVar11 < 0) {
          iVar8 = -8;
          do {
            uVar7 = -(uint)((pD->m_bit_buf >> (iVar8 + 0x1fU & 0x1f) & 1) != 0) - (int)uVar11;
            if (((int)(iVar8 + 0x1fU) < 0) || (0x1ff < uVar7)) goto LAB_00152dc9;
            uVar11 = (ulong)phVar4->tree[uVar7];
            iVar8 = iVar8 + -1;
          } while ((int)phVar4->tree[uVar7] < 0);
          uVar7 = -iVar8;
        }
        else {
          if (0xff < phVar4->look_up[pD->m_bit_buf >> 0x18]) {
            __assert_fail("symbol < JPGD_HUFF_CODE_SIZE_MAX_LENGTH",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/3rdparty/jpeg-compressor/jpgd.cpp"
                          ,0x227,"int jpgd::jpeg_decoder::huff_decode(huff_tables *)");
          }
          uVar7 = (uint)phVar4->code_size[uVar11];
        }
        get_bits_no_markers(pD,uVar7);
        uVar9 = uVar11 >> 4 & 0xfffffff;
        uVar7 = (uint)uVar11 & 0xf;
        iVar8 = (int)uVar9;
        if ((uVar11 & 0xf) == 0) {
          if (iVar8 != 0xf) {
            iVar6 = 1 << ((byte)uVar9 & 0x1f);
            pD->m_eob_run = iVar6;
            if (0xf < (uint)uVar11) {
              uVar5 = get_bits_no_markers(pD,iVar8);
              iVar6 = uVar5 + pD->m_eob_run;
            }
            goto LAB_00152c18;
          }
          if (0x30 < iVar10) goto LAB_00152dc9;
          iVar8 = iVar10 + 0xf;
        }
        else {
          iVar8 = iVar8 + iVar10;
          if (0x3f < iVar8) goto LAB_00152dc9;
          uVar5 = get_bits_no_markers(pD,uVar7);
          if ((int)uVar5 < *(int *)(s_extend_test + (ulong)uVar7 * 4)) {
            uVar5 = uVar5 + *(int *)(s_extend_offset + (ulong)uVar7 * 4);
          }
          *(short *)(puVar3 + (long)(int)(&g_ZAG)[iVar8] * 2 +
                              (long)(iVar6 * block_y * iVar1) + (long)(block_x * iVar1)) =
               (short)(uVar5 << ((byte)pD->m_successive_low & 0x1f));
        }
        iVar10 = iVar8 + 1;
      } while (iVar8 < pD->m_spectral_end);
    }
  }
  else {
LAB_00152c18:
    pD->m_eob_run = iVar6 + -1;
  }
  return;
}

Assistant:

void jpeg_decoder::decode_block_ac_first(jpeg_decoder* pD, int component_id, int block_x, int block_y)
	{
		int k, s, r;

		if (pD->m_eob_run)
		{
			pD->m_eob_run--;
			return;
		}

		jpgd_block_coeff_t* p = pD->coeff_buf_getp(pD->m_ac_coeffs[component_id], block_x, block_y);

		for (k = pD->m_spectral_start; k <= pD->m_spectral_end; k++)
		{
			unsigned int idx = pD->m_comp_ac_tab[component_id];
			if (idx >= JPGD_MAX_HUFF_TABLES)
				pD->stop_decoding(JPGD_DECODE_ERROR);

			s = pD->huff_decode(pD->m_pHuff_tabs[idx]);

			r = s >> 4;
			s &= 15;

			if (s)
			{
				if ((k += r) > 63)
					pD->stop_decoding(JPGD_DECODE_ERROR);

				r = pD->get_bits_no_markers(s);
				s = JPGD_HUFF_EXTEND(r, s);

				p[g_ZAG[k]] = static_cast<jpgd_block_coeff_t>(s << pD->m_successive_low);
			}
			else
			{
				if (r == 15)
				{
					if ((k += 15) > 63)
						pD->stop_decoding(JPGD_DECODE_ERROR);
				}
				else
				{
					pD->m_eob_run = 1 << r;

					if (r)
						pD->m_eob_run += pD->get_bits_no_markers(r);

					pD->m_eob_run--;

					break;
				}
			}
		}
	}